

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

int __thiscall
CEditor::DoButton_Image
          (CEditor *this,void *pID,char *pText,int Checked,CUIRect *pRect,int Flags,char *pToolTip,
          bool Used)

{
  void *pvVar1;
  float fVar2;
  int iVar3;
  char *pText_00;
  long in_FS_OFFSET;
  anon_union_4_2_94730227_for_vector4_base<float>_1 aVar4;
  float extraout_XMM0_Da;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aVar5;
  float fVar6;
  vec4 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._8_8_ = 0x3f00000000000000;
  if (Checked < 0) {
    aVar4.x = 0.0;
    aVar5.y = 0.0;
  }
  else {
    pvVar1 = (this->m_UI).m_pHotItem;
    if (Checked == 0) {
      if (pvVar1 == pID) {
        local_48._8_8_ = 0x3f40000000000000;
      }
      local_48._8_8_ = local_48._8_8_ + 0x3f800000;
      aVar4.x = 1.0;
      aVar5.y = 1.0;
    }
    else {
      if (pvVar1 == pID) {
        local_48._8_8_ = 0x3f40000000000000;
      }
      aVar4.x = 1.0;
      aVar5.y = 0.0;
    }
  }
  local_48.field_1.y = aVar5.y;
  local_48.field_0.x = aVar4.x;
  if (!Used) {
    fVar2 = (float)local_48._8_8_;
    local_48.field_1.y = aVar5.y * 0.5;
    local_48.field_0.x = aVar4.x * 0.5;
    local_48.field_3 = SUB84((ulong)local_48._8_8_ >> 0x20,0);
    local_48.field_2.z = fVar2 * 0.5;
  }
  fVar2 = pRect->w;
  (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
            (0x41200000,this->m_pTextRender,pText,0xffffffff);
  fVar6 = (fVar2 * 8.0) / extraout_XMM0_Da;
  fVar2 = 10.0;
  if (fVar6 <= 10.0) {
    fVar2 = fVar6;
  }
  CUIRect::Draw(pRect,&local_48,3.0,0xf);
  iVar3 = 5;
  CUI::DoLabel(&this->m_UI,pRect,pText,
               (float)(-(uint)(fVar6 < 6.0) & 0x40c00000 | ~-(uint)(fVar6 < 6.0) & (uint)fVar2),5,
               -1.0,true);
  iVar3 = DoButton_Editor_Common(this,pID,pText_00,iVar3,pRect,Flags,pToolTip);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int CEditor::DoButton_Image(const void *pID, const char *pText, int Checked, const CUIRect *pRect, int Flags, const char *pToolTip, bool Used)
{
	// darken the button if not used
	vec4 ButtonColor = GetButtonColor(pID, Checked);
	if(!Used)
		ButtonColor *= vec4(0.5f, 0.5f, 0.5f, 1.0f);

	const float FontSize = clamp(8.0f * pRect->w / TextRender()->TextWidth(10.0f, pText, -1), 6.0f, 10.0f);
	pRect->Draw(ButtonColor, 3.0f);
	UI()->DoLabel(pRect, pText, FontSize, TEXTALIGN_MC);
	return DoButton_Editor_Common(pID, pText, Checked, pRect, Flags, pToolTip);
}